

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackArchiveGenerator.cxx
# Opt level: O0

cmCPackGenerator * cmCPackArchiveGenerator::CreateTGZGenerator(void)

{
  cmCPackArchiveGenerator *this;
  allocator<char> local_61;
  string local_60;
  allocator<char> local_29;
  string local_28;
  
  this = (cmCPackArchiveGenerator *)operator_new(0x1b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"paxr",&local_29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,".tar.gz",&local_61);
  cmCPackArchiveGenerator(this,CompressGZip,&local_28,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  std::__cxx11::string::~string((string *)&local_28);
  std::allocator<char>::~allocator(&local_29);
  return &this->super_cmCPackGenerator;
}

Assistant:

cmCPackGenerator* cmCPackArchiveGenerator::CreateTGZGenerator()
{
  return new cmCPackArchiveGenerator(cmArchiveWrite::CompressGZip, "paxr",
                                     ".tar.gz");
}